

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testLimits.cpp
# Opt level: O2

float anon_unknown.dwarf_1056e8::mypow(int x,int y)

{
  int iVar1;
  float fVar2;
  
  iVar1 = -y;
  if (0 < y) {
    iVar1 = y;
  }
  fVar2 = 1.0;
  for (; 0 < iVar1; iVar1 = iVar1 + -1) {
    fVar2 = fVar2 * (float)x;
  }
  if (y < 0) {
    fVar2 = 1.0 / fVar2;
  }
  return fVar2;
}

Assistant:

float
mypow (int x, int y)
{
    bool negative = false;

    if (y < 0)
    {
        negative = true;
        y        = -y;
    }

    float z = 1;

    while (y > 0)
    {
        z *= x;
        y -= 1;
    }

    if (negative) z = 1 / z;

    return z;
}